

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

bool spvtools::opt::analysis::anon_unknown_33::CompareTwoVectors(U32VecVec *a,U32VecVec *b)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  bool bVar1;
  size_type __n;
  size_type sVar2;
  const_reference __x_00;
  const_reference __y;
  iterator iVar3;
  iterator iVar4;
  reference ppvVar5;
  uint local_a8;
  uint32_t i_1;
  const_reference pvStack_70;
  anon_class_1_0_00000001 cmp;
  const_reference local_68;
  uint local_5c;
  undefined1 local_58 [4];
  uint32_t i;
  vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  b_ptrs;
  vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  a_ptrs;
  size_type size;
  U32VecVec *b_local;
  U32VecVec *a_local;
  
  __n = std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::size(a);
  sVar2 = std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::size(b);
  if (__n == sVar2) {
    if (__n == 0) {
      a_local._7_1_ = true;
    }
    else if (__n == 1) {
      __x_00 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::front(a);
      __y = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::front(b);
      a_local._7_1_ = std::operator==(__x_00,__y);
    }
    else {
      std::
      vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ::vector((vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                *)&b_ptrs.
                   super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ::vector((vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                *)local_58);
      std::
      vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ::reserve((vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 *)&b_ptrs.
                    super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__n);
      std::
      vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ::reserve((vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 *)&b_ptrs.
                    super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__n);
      for (local_5c = 0; local_5c < __n; local_5c = local_5c + 1) {
        local_68 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::operator[](a,(ulong)local_5c);
        std::
        vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
        ::push_back((vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                     *)&b_ptrs.
                        super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_68);
        pvStack_70 = std::
                     vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::operator[](b,(ulong)local_5c);
        std::
        vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
        ::push_back((vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                     *)local_58,&stack0xffffffffffffff90);
      }
      iVar3 = std::
              vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
              ::begin((vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                       *)&b_ptrs.
                          super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar4 = std::
              vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
              ::end((vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                     *)&b_ptrs.
                        super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      sort<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const**,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>>,spvtools::opt::analysis::(anonymous_namespace)::CompareTwoVectors(std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>)::__0>
                (iVar3._M_current,iVar4._M_current);
      iVar3 = std::
              vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
              ::begin((vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                       *)local_58);
      iVar4 = std::
              vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
              ::end((vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                     *)local_58);
      std::
      sort<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const**,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>>,spvtools::opt::analysis::(anonymous_namespace)::CompareTwoVectors(std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>)::__0>
                (iVar3._M_current,iVar4._M_current);
      for (local_a8 = 0; local_a8 < __n; local_a8 = local_a8 + 1) {
        ppvVar5 = std::
                  vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                  ::operator[]((vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                *)&b_ptrs.
                                   super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)local_a8);
        __x = *ppvVar5;
        ppvVar5 = std::
                  vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                  ::operator[]((vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                                *)local_58,(ulong)local_a8);
        bVar1 = std::operator!=(__x,*ppvVar5);
        if (bVar1) {
          a_local._7_1_ = false;
          goto LAB_008d0785;
        }
      }
      a_local._7_1_ = true;
LAB_008d0785:
      std::
      vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ::~vector((vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 *)local_58);
      std::
      vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ::~vector((vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 *)&b_ptrs.
                    super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool CompareTwoVectors(const U32VecVec a, const U32VecVec b) {
  const auto size = a.size();
  if (size != b.size()) return false;

  if (size == 0) return true;
  if (size == 1) return a.front() == b.front();

  std::vector<const std::vector<uint32_t>*> a_ptrs, b_ptrs;
  a_ptrs.reserve(size);
  a_ptrs.reserve(size);
  for (uint32_t i = 0; i < size; ++i) {
    a_ptrs.push_back(&a[i]);
    b_ptrs.push_back(&b[i]);
  }

  const auto cmp = [](const std::vector<uint32_t>* m,
                      const std::vector<uint32_t>* n) {
    return m->front() < n->front();
  };

  std::sort(a_ptrs.begin(), a_ptrs.end(), cmp);
  std::sort(b_ptrs.begin(), b_ptrs.end(), cmp);

  for (uint32_t i = 0; i < size; ++i) {
    if (*a_ptrs[i] != *b_ptrs[i]) return false;
  }
  return true;
}